

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O0

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,OperationSamplingStrategy *strategy)

{
  OperationSamplingStrategy *pOVar1;
  OperationSamplingStrategy *this;
  const_reference this_00;
  allocator local_a1;
  key_type local_a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_80 [2];
  allocator local_59;
  key_type local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  OperationSamplingStrategy *local_18;
  OperationSamplingStrategy *strategy_local;
  json *json_local;
  
  local_18 = strategy;
  strategy_local = (OperationSamplingStrategy *)json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"operation",&local_59);
  this_00 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(json,&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_38,this_00);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_operation
            ((string *)strategy);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  this = strategy_local;
  pOVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"probabilisticSampling",&local_a1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)this,&local_a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_ProbabilisticSamplingStrategy<jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy,_0>
            (local_80);
  jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)pOVar1);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy((ProbabilisticSamplingStrategy *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      OperationSamplingStrategy& strategy)
{
    FIELD_FROM_JSON(strategy, operation);
    FIELD_FROM_JSON(strategy, probabilisticSampling);
}